

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<int,_phmap::priv::NonStandardLayout>_&,_std::pair<const_int,_phmap::priv::NonStandardLayout>_>
::CastImpl(Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *__return_storage_ptr__,
          pair<const_int,_phmap::priv::NonStandardLayout> *value)

{
  pair<int,_phmap::priv::NonStandardLayout> local_40;
  
  std::pair<int,_phmap::priv::NonStandardLayout>::
  pair<const_int,_phmap::priv::NonStandardLayout,_true>(&local_40,value);
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
            (__return_storage_ptr__,&local_40);
  phmap::priv::NonStandardLayout::~NonStandardLayout(&local_40.second);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }